

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

bool __thiscall QFileDialogPrivate::itemAlreadyExists(QFileDialogPrivate *this,QString *fileName)

{
  QWidget *this_00;
  StandardButton SVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QString local_60;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::tr((char *)&local_60,(char *)&QFileDialog::staticMetaObject,0x6f4aaf);
  QVar2.m_size = (size_t)&local_60;
  QVar2.field_0.m_data = &local_48;
  QString::arg_impl(QVar2,(int)(fileName->d).ptr,(QChar)(char16_t)(fileName->d).size);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  QWidget::windowTitle(&local_60,this_00);
  SVar1 = QMessageBox::warning(this_00,&local_60,&local_48,(StandardButtons)0x14000,No);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SVar1 == Yes;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDialogPrivate::itemAlreadyExists(const QString &fileName)
{
#if QT_CONFIG(messagebox)
    Q_Q(QFileDialog);
    const QString msg = QFileDialog::tr("%1 already exists.\nDo you want to replace it?").arg(fileName);
    using B = QMessageBox;
    const auto res = B::warning(q, q->windowTitle(), msg, B::Yes | B::No, B::No);
    return res == B::Yes;
#endif
    return false;
}